

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O3

void Opcodes::run(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  pointer pbVar1;
  pointer pcVar2;
  uint8_t uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_00;
  RAM *extraout_RDX;
  RAM *extraout_RDX_00;
  RAM *mem_00;
  _Alloc_hider sfr_00;
  string local_50;
  
  pbVar1 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  cmd_00 = cmd;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  uVar3 = getHexOpcode(&local_50);
  mem_00 = extraout_RDX;
  sfr_00._M_p = local_50._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    mem_00 = extraout_RDX_00;
  }
  if (uVar3 == 0x80) {
    ADD((SFLAG_Register *)sfr_00._M_p,gr,mem_00,cmd);
  }
  else if (uVar3 == '7') {
    AAA(sfr,gr,mem_00,cmd_00);
  }
  return;
}

Assistant:

void Opcodes::run(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    // Get the numeric opcode.
    uint8_t opcodeNumber = Opcodes::getHexOpcode(cmd[0]);
    // Check to see if the opcode is valid.
    if (opcodeNumber == 0x0) {
        // This opcode is not valid. Return for now.
        // TODO: Throw a triple-step error.
        return;
    }
    // Opcode is valid, compare it against the list of added opcode functions.
    switch (opcodeNumber) {
        case 0x37:
            AAA(sfr, gr, mem, cmd);
            break;
        case 0x80:
            ADD(sfr, gr, mem, cmd);
            break;
        default:
            break;
    }
}